

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_devices.cpp
# Opt level: O0

void __thiscall
cubeb_stream_get_current_device_Test::TestBody(cubeb_stream_get_current_device_Test *this)

{
  FILE *__stream;
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  char *pcVar4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  cubeb_device *device;
  unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> cleanup_stream_at_exit;
  AssertionResult gtest_ar_1;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  cubeb_stream *stream;
  unique_ptr<cubeb,_void_(*)(cubeb_*)> cleanup_cubeb_at_exit;
  AssertionResult gtest_ar;
  int r;
  cubeb *ctx;
  cubeb *in_stack_fffffffffffffe88;
  cubeb_stream *__p;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe94;
  char (*in_stack_fffffffffffffe98) [33];
  code *val;
  Message *in_stack_fffffffffffffea0;
  code *this_00;
  char *in_stack_fffffffffffffea8;
  AssertHelper in_stack_fffffffffffffed8;
  cubeb_stream_params *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef8;
  AssertHelper in_stack_ffffffffffffff00;
  AssertionResult local_e8;
  undefined8 *local_d8;
  cubeb_stream_params *in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff38;
  cubeb_data_callback in_stack_ffffffffffffff40;
  AssertHelper in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  AssertionResult local_a0;
  cubeb_stream local_90;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  code *local_60;
  uint local_44;
  AssertHelper local_40 [2];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  undefined8 local_10;
  
  local_10 = 0;
  local_14 = common_init((cubeb **)in_stack_fffffffffffffea0,*in_stack_fffffffffffffe98);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
             (int *)in_stack_fffffffffffffe98,
             (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffea0);
    pMVar2 = testing::Message::operator<<(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x136787);
    testing::internal::AssertHelper::AssertHelper
              (local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
               ,0xd8,pcVar3);
    testing::internal::AssertHelper::operator=(local_40,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    testing::Message::~Message((Message *)0x1367d4);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1367f9);
  if (local_44 == 0) {
    local_60 = cubeb_destroy;
    std::unique_ptr<cubeb,void(*)(cubeb*)>::unique_ptr<void(*)(cubeb*),void>
              ((unique_ptr<cubeb,_void_(*)(cubeb_*)> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,
               (__enable_if_t<_is_lvalue_reference<void_(*)(cubeb_*)>::value,_void_(*&&)(cubeb_*)>)
               0x136837);
    __stream = _stdout;
    pcVar3 = cubeb_get_backend_id(in_stack_fffffffffffffe88);
    fprintf(__stream,"Getting current devices for backend %s\n",pcVar3);
    local_68 = 0;
    local_90.context._0_4_ = 2;
    local_7c = 2;
    local_90.context._4_4_ = 48000;
    local_78 = 48000;
    local_90.user_ptr._0_4_ = 1;
    local_74 = 1;
    local_90.user_ptr._4_4_ = 4;
    local_70 = 4;
    local_80 = 0;
    local_6c = 0;
    __p = &local_90;
    uVar5 = 0x400;
    val = data_cb_duplex;
    this_00 = state_cb_duplex;
    pcVar3 = (char *)0x0;
    local_14 = cubeb_stream_init((cubeb *)in_stack_ffffffffffffff00.data_,
                                 (cubeb_stream **)in_stack_fffffffffffffef8.ptr_,
                                 in_stack_fffffffffffffef0,
                                 (cubeb_devid)
                                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8.data_,
                                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                                 in_stack_ffffffffffffff40,
                                 (cubeb_state_callback)in_stack_ffffffffffffff48.data_,
                                 in_stack_ffffffffffffff50);
    testing::internal::EqHelper<false>::Compare<int,__0>
              (pcVar3,(char *)this_00,(int *)val,
               (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      pMVar2 = testing::Message::operator<<((Message *)this_00,(char (*) [32])val);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1369cc);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                 ,0xed,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff48,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48);
      testing::Message::~Message((Message *)0x136a19);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x136a3e);
    if (local_44 == 0) {
      std::unique_ptr<cubeb_stream,void(*)(cubeb_stream*)>::unique_ptr<void(*)(cubeb_stream*),void>
                ((unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> *)
                 CONCAT44(in_stack_fffffffffffffe94,uVar5),__p,
                 (__enable_if_t<_is_lvalue_reference<void_(*)(cubeb_stream_*)>::value,_void_(*&&)(cubeb_stream_*)>
                  )0x136a7b);
      local_14 = cubeb_stream_get_current_device(__p,(cubeb_device **)0x136a90);
      if (local_14 == -4) {
        fprintf(_stderr,
                "Getting current device is not supported for this backend, skipping this test.\n");
        local_44 = 1;
      }
      else {
        testing::internal::EqHelper<false>::Compare<int,__0>
                  (pcVar3,(char *)this_00,(int *)val,
                   (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
        if (!bVar1) {
          testing::Message::Message((Message *)this_00);
          pMVar2 = testing::Message::operator<<((Message *)this_00,(char (*) [30])val);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x136b4a);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff00,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                     ,0xf8,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff00,pMVar2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff00);
          testing::Message::~Message((Message *)0x136b8e);
        }
        local_44 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x136bb3);
        if (local_44 == 0) {
          fprintf(_stdout,"Current output device: %s\n",*local_d8);
          fprintf(_stdout,"Current input device: %s\n",local_d8[1]);
          local_14 = cubeb_stream_device_destroy(__p,(cubeb_device *)0x136c20);
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (pcVar3,(char *)this_00,(int *)val,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffef0);
          if (!bVar1) {
            testing::Message::Message((Message *)this_00);
            pMVar2 = testing::Message::operator<<((Message *)this_00,(char (*) [33])val);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x136c90);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffed8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                       ,0xfe,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffed8,pMVar2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed8)
            ;
            testing::Message::~Message((Message *)0x136cd1);
          }
          local_44 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x136cf3);
          if (local_44 == 0) {
            local_44 = 0;
          }
        }
      }
      std::unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)>::~unique_ptr
                ((unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> *)
                 CONCAT44(in_stack_fffffffffffffe94,uVar5));
    }
    std::unique_ptr<cubeb,_void_(*)(cubeb_*)>::~unique_ptr
              ((unique_ptr<cubeb,_void_(*)(cubeb_*)> *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
  }
  return;
}

Assistant:

TEST(cubeb, stream_get_current_device)
{
  cubeb * ctx = NULL;
  int r = common_init(&ctx, "Cubeb audio test");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  fprintf(stdout, "Getting current devices for backend %s\n",
    cubeb_get_backend_id(ctx));

  cubeb_stream * stream = NULL;
  cubeb_stream_params input_params;
  cubeb_stream_params output_params;

  input_params.format = output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  input_params.rate = output_params.rate = 48000;
  input_params.channels = output_params.channels = 1;
  input_params.layout = output_params.layout = CUBEB_LAYOUT_MONO;
  input_params.prefs = output_params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "Cubeb duplex",
                        NULL, &input_params, NULL, &output_params,
                        1024, data_cb_duplex, state_cb_duplex, nullptr);
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";
  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
    cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  cubeb_device * device;
  r = cubeb_stream_get_current_device(stream, &device);
  if (r == CUBEB_ERROR_NOT_SUPPORTED) {
    fprintf(stderr, "Getting current device is not supported"
                    " for this backend, skipping this test.\n");
    return;
  }
  ASSERT_EQ(r, CUBEB_OK) << "Error getting current devices";

  fprintf(stdout, "Current output device: %s\n", device->output_name);
  fprintf(stdout, "Current input device: %s\n", device->input_name);

  r = cubeb_stream_device_destroy(stream, device);
  ASSERT_EQ(r, CUBEB_OK) << "Error destroying current devices";
}